

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O0

void pulse_subscribe_callback
               (pa_context *ctx,pa_subscription_event_type_t t,uint32_t index,void *userdata)

{
  void *in_RCX;
  uint in_EDX;
  uint in_ESI;
  cubeb_conflict *context;
  
  if ((in_ESI & 0xf) < 2) {
    if (g_cubeb_log_level != CUBEB_LOG_DISABLED) {
      if (((in_ESI & 0xf) == 1) && ((in_ESI & 0x30) == 0x20)) {
        if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) &&
           (g_cubeb_log_level != CUBEB_LOG_DISABLED)) {
          (*g_cubeb_log_callback)
                    ("%s:%d: Removing source index %d\n","cubeb_pulse.c",0x62d,(ulong)in_EDX);
        }
      }
      else if (((in_ESI & 0xf) == 1) &&
              ((((in_ESI & 0x30) == 0 && (g_cubeb_log_callback != (cubeb_log_callback)0x0)) &&
               (g_cubeb_log_level != CUBEB_LOG_DISABLED)))) {
        (*g_cubeb_log_callback)
                  ("%s:%d: Adding source index %d\n","cubeb_pulse.c",0x632,(ulong)in_EDX);
      }
      if (((in_ESI & 0xf) == 0) && ((in_ESI & 0x30) == 0x20)) {
        if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) &&
           (g_cubeb_log_level != CUBEB_LOG_DISABLED)) {
          (*g_cubeb_log_callback)
                    ("%s:%d: Removing sink index %d\n","cubeb_pulse.c",0x638,(ulong)in_EDX);
        }
      }
      else if (((in_ESI & 0xf) == 0) &&
              ((((in_ESI & 0x30) == 0 && (g_cubeb_log_callback != (cubeb_log_callback)0x0)) &&
               (g_cubeb_log_level != CUBEB_LOG_DISABLED)))) {
        (*g_cubeb_log_callback)("%s:%d: Adding sink index %d\n","cubeb_pulse.c",0x63d,(ulong)in_EDX)
        ;
      }
    }
    if (((in_ESI & 0x30) == 0x20) || ((in_ESI & 0x30) == 0)) {
      if ((in_ESI & 0xf) == 1) {
        (**(code **)((long)in_RCX + 0x48))(in_RCX,*(undefined8 *)((long)in_RCX + 0x50));
      }
      if ((in_ESI & 0xf) == 0) {
        (**(code **)((long)in_RCX + 0x38))(in_RCX,*(undefined8 *)((long)in_RCX + 0x40));
      }
    }
  }
  else if (((in_ESI & 0xf) == 7) && ((in_ESI & 0x30) == 0x10)) {
    if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) &&
       (g_cubeb_log_level != CUBEB_LOG_DISABLED)) {
      (*g_cubeb_log_callback)("%s:%d: Server changed %d\n","cubeb_pulse.c",0x620,(ulong)in_EDX);
    }
    (*cubeb_pa_context_get_server_info)
              (*(pa_context **)((long)in_RCX + 0x18),server_info_callback,in_RCX);
  }
  return;
}

Assistant:

static void
pulse_subscribe_callback(pa_context * ctx, pa_subscription_event_type_t t,
                         uint32_t index, void * userdata)
{
  (void)ctx;
  cubeb * context = userdata;

  switch (t & PA_SUBSCRIPTION_EVENT_FACILITY_MASK) {
  case PA_SUBSCRIPTION_EVENT_SERVER:
    if ((t & PA_SUBSCRIPTION_EVENT_TYPE_MASK) == PA_SUBSCRIPTION_EVENT_CHANGE) {
      LOG("Server changed %d", index);
      WRAP(pa_context_get_server_info)
      (context->context, server_info_callback, context);
    }
    break;
  case PA_SUBSCRIPTION_EVENT_SOURCE:
  case PA_SUBSCRIPTION_EVENT_SINK:

    if (g_cubeb_log_level) {
      if ((t & PA_SUBSCRIPTION_EVENT_FACILITY_MASK) ==
              PA_SUBSCRIPTION_EVENT_SOURCE &&
          (t & PA_SUBSCRIPTION_EVENT_TYPE_MASK) ==
              PA_SUBSCRIPTION_EVENT_REMOVE) {
        LOG("Removing source index %d", index);
      } else if ((t & PA_SUBSCRIPTION_EVENT_FACILITY_MASK) ==
                     PA_SUBSCRIPTION_EVENT_SOURCE &&
                 (t & PA_SUBSCRIPTION_EVENT_TYPE_MASK) ==
                     PA_SUBSCRIPTION_EVENT_NEW) {
        LOG("Adding source index %d", index);
      }
      if ((t & PA_SUBSCRIPTION_EVENT_FACILITY_MASK) ==
              PA_SUBSCRIPTION_EVENT_SINK &&
          (t & PA_SUBSCRIPTION_EVENT_TYPE_MASK) ==
              PA_SUBSCRIPTION_EVENT_REMOVE) {
        LOG("Removing sink index %d", index);
      } else if ((t & PA_SUBSCRIPTION_EVENT_FACILITY_MASK) ==
                     PA_SUBSCRIPTION_EVENT_SINK &&
                 (t & PA_SUBSCRIPTION_EVENT_TYPE_MASK) ==
                     PA_SUBSCRIPTION_EVENT_NEW) {
        LOG("Adding sink index %d", index);
      }
    }

    if ((t & PA_SUBSCRIPTION_EVENT_TYPE_MASK) == PA_SUBSCRIPTION_EVENT_REMOVE ||
        (t & PA_SUBSCRIPTION_EVENT_TYPE_MASK) == PA_SUBSCRIPTION_EVENT_NEW) {
      if ((t & PA_SUBSCRIPTION_EVENT_FACILITY_MASK) ==
          PA_SUBSCRIPTION_EVENT_SOURCE) {
        context->input_collection_changed_callback(
            context, context->input_collection_changed_user_ptr);
      }
      if ((t & PA_SUBSCRIPTION_EVENT_FACILITY_MASK) ==
          PA_SUBSCRIPTION_EVENT_SINK) {
        context->output_collection_changed_callback(
            context, context->output_collection_changed_user_ptr);
      }
    }
    break;
  }
}